

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessauthenticationmanager.cpp
# Opt level: O3

iterator __thiscall
QNetworkAuthenticationCache::findClosestMatch(QNetworkAuthenticationCache *this,QString *domain)

{
  QList<QNetworkAuthenticationCredential> *this_00;
  char cVar1;
  iterator iVar2;
  iterator iVar3;
  long lVar4;
  
  this_00 = &this->super_QList<QNetworkAuthenticationCredential>;
  iVar2 = QList<QNetworkAuthenticationCredential>::begin(this_00);
  iVar3 = QList<QNetworkAuthenticationCredential>::end(this_00);
  iVar2 = std::
          __lower_bound<QList<QNetworkAuthenticationCredential>::iterator,QString,__gnu_cxx::__ops::_Iter_less_val>
                    (iVar2.i,iVar3.i,domain);
  iVar3 = QList<QNetworkAuthenticationCredential>::end(this_00);
  if (iVar2.i == iVar3.i) {
    lVar4 = -0x48;
    if ((this->super_QList<QNetworkAuthenticationCredential>).d.size == 0) {
      lVar4 = 0;
    }
    iVar2.i = (QNetworkAuthenticationCredential *)((long)&((iVar2.i)->domain).d.d + lVar4);
  }
  iVar3 = QList<QNetworkAuthenticationCredential>::end(this_00);
  if (iVar2.i != iVar3.i) {
    cVar1 = QString::startsWith((QString *)domain,(CaseSensitivity)iVar2.i);
    if (cVar1 != '\0') {
      return (iterator)iVar2.i;
    }
  }
  iVar2 = QList<QNetworkAuthenticationCredential>::end(this_00);
  return (iterator)iVar2.i;
}

Assistant:

iterator findClosestMatch(const QString &domain)
    {
        iterator it = std::lower_bound(begin(), end(), domain);
        if (it == end() && !isEmpty())
            --it;
        if (it == end() || !domain.startsWith(it->domain))
            return end();
        return it;
    }